

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

char * lws_get_urlarg_by_name(lws *wsi,char *name,char *buf,int len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = strlen(name);
  iVar1 = lws_hdr_copy_fragment(wsi,buf,len,WSI_TOKEN_HTTP_URI_ARGS,0);
  if (-1 < iVar1) {
    iVar1 = 1;
    do {
      iVar2 = strncmp(buf,name,(long)(int)sVar3);
      if (iVar2 == 0) {
        return buf + (int)sVar3;
      }
      iVar2 = lws_hdr_copy_fragment(wsi,buf,len,WSI_TOKEN_HTTP_URI_ARGS,iVar1);
      iVar1 = iVar1 + 1;
    } while (-1 < iVar2);
  }
  return (char *)0x0;
}

Assistant:

const char *
lws_get_urlarg_by_name(struct lws *wsi, const char *name, char *buf, int len)
{
	int n = 0, sl = (int)strlen(name);

	while (lws_hdr_copy_fragment(wsi, buf, len,
			  WSI_TOKEN_HTTP_URI_ARGS, n) >= 0) {

		if (!strncmp(buf, name, sl))
			return buf + sl;

		n++;
	}

	return NULL;
}